

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
* __thiscall
rangeless::fn::impl::
maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
::operator=(maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
            *this,maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                  *other)

{
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  *val;
  maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  *other_local;
  maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  *this_local;
  
  if (this != other) {
    if ((other->m_empty & 1U) == 0) {
      val = operator*(other);
      reset(this,val);
      reset(other);
    }
    else {
      reset(this);
    }
  }
  return this;
}

Assistant:

maybe& operator=(maybe&& other) noexcept
        {
            if(this == &other) {
                ;
            } else if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            } else {
                reset();
            }
            return *this;
        }